

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

size_t WitnessSigOps(int witversion,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *witprogram,
                    CScriptWitness *witness)

{
  long lVar1;
  pointer pvVar2;
  uint uVar3;
  long lVar4;
  long in_FS_OFFSET;
  size_t sStack_40;
  CScript subscript;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (witversion == 0) {
    lVar4 = (long)(witprogram->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(witprogram->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar4 == 0x14) {
      sStack_40 = 1;
      goto LAB_0063616d;
    }
    if ((lVar4 == 0x20) &&
       (pvVar2 = (witness->stack).
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       pvVar2 != (witness->stack).
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                (&subscript.super_CScriptBase,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )pvVar2[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )pvVar2[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      uVar3 = CScript::GetSigOpCount((CScript *)&subscript.super_CScriptBase,true);
      sStack_40 = (size_t)uVar3;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&subscript.super_CScriptBase);
      goto LAB_0063616d;
    }
  }
  sStack_40 = 0;
LAB_0063616d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sStack_40;
  }
  __stack_chk_fail();
}

Assistant:

size_t static WitnessSigOps(int witversion, const std::vector<unsigned char>& witprogram, const CScriptWitness& witness)
{
    if (witversion == 0) {
        if (witprogram.size() == WITNESS_V0_KEYHASH_SIZE)
            return 1;

        if (witprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE && witness.stack.size() > 0) {
            CScript subscript(witness.stack.back().begin(), witness.stack.back().end());
            return subscript.GetSigOpCount(true);
        }
    }

    // Future flags may be implemented here.
    return 0;
}